

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O2

bool __thiscall
iDynTree::BerdyDynamicVariable::operator==(BerdyDynamicVariable *this,BerdyDynamicVariable *v)

{
  __type _Var1;
  
  if (v->type == this->type) {
    _Var1 = std::operator==(&v->id,&this->id);
    return _Var1;
  }
  return false;
}

Assistant:

bool BerdyDynamicVariable::operator==(const struct BerdyDynamicVariable &v) const
{
    return v.type == this->type
    && v.id == this->id;
}